

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O2

void __thiscall
QMimeAllGlobPatterns::matchingGlobs
          (QMimeAllGlobPatterns *this,QString *fileName,QMimeGlobMatchResult *result,
          AddMatchFilterFunc *filterFunc)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  QString *mime;
  QString *__args;
  long in_FS_OFFSET;
  QStringBuilder<QLatin1String,_const_QString_&> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QMimeGlobPatternList::match(&this->m_highWeightGlobs,result,fileName,filterFunc);
  uVar2 = QString::lastIndexOf(fileName,(QChar)0x2e,CaseSensitive);
  if (uVar2 != 0xffffffffffffffff) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::right((QString *)&local_78,fileName,~uVar2 + (fileName->d).size);
    QString::toLower_helper((QString *)&local_58,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QHash<QString,_QList<QString>_>::value
              ((QList<QString> *)&local_78,&this->m_fastPatterns,(QString *)&local_58);
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_b0.a.m_size = 2;
    local_b0.a.m_data = "*.";
    local_b0.b = (QString *)&local_58;
    QStringBuilder<QLatin1String,_const_QString_&>::convertTo<QString>
              ((QString *)&local_98,&local_b0);
    __args = local_78.ptr;
    for (lVar3 = local_78.size * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
      bVar1 = std::function<bool_(const_QString_&)>::operator()(filterFunc,__args);
      if (bVar1) {
        QMimeGlobMatchResult::addMatch(result,__args,0x32,(QString *)&local_98,local_58.size);
      }
      __args = __args + 1;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  QMimeGlobPatternList::match(&this->m_lowWeightGlobs,result,fileName,filterFunc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeAllGlobPatterns::matchingGlobs(const QString &fileName, QMimeGlobMatchResult &result,
                                         const AddMatchFilterFunc &filterFunc) const
{
    // First try the high weight matches (>50), if any.
    m_highWeightGlobs.match(result, fileName, filterFunc);

    // Now use the "fast patterns" dict, for simple *.foo patterns with weight 50
    // (which is most of them, so this optimization is definitely worth it)
    const qsizetype lastDot = fileName.lastIndexOf(u'.');
    if (lastDot != -1) { // if no '.', skip the extension lookup
        const qsizetype ext_len = fileName.size() - lastDot - 1;
        const QString simpleExtension = fileName.right(ext_len).toLower();
        // (toLower because fast patterns are always case-insensitive and saved as lowercase)

        const QStringList matchingMimeTypes = m_fastPatterns.value(simpleExtension);
        const QString simplePattern = "*."_L1 + simpleExtension;
        for (const QString &mime : matchingMimeTypes) {
            if (filterFunc(mime)) {
                result.addMatch(mime, 50, simplePattern, simpleExtension.size());
            }
        }
        // Can't return yet; *.tar.bz2 has to win over *.bz2, so we need the low-weight mimetypes anyway,
        // at least those with weight 50.
    }

    // Finally, try the low weight matches (<=50)
    m_lowWeightGlobs.match(result, fileName, filterFunc);
}